

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlLoadEntityContent(xmlParserCtxtPtr ctxt,xmlEntityPtr entity)

{
  xmlGenericErrorFunc p_Var1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  xmlGenericErrorFunc *pp_Var5;
  void **ppvVar6;
  bool local_52;
  int local_3c;
  int local_38;
  int count;
  int c;
  int l;
  xmlBufferPtr buf;
  xmlParserInputPtr input;
  xmlEntityPtr entity_local;
  xmlParserCtxtPtr ctxt_local;
  
  local_3c = 0;
  input = (xmlParserInputPtr)entity;
  entity_local = (xmlEntityPtr)ctxt;
  if ((((ctxt == (xmlParserCtxtPtr)0x0) || (entity == (xmlEntityPtr)0x0)) ||
      ((entity->etype != XML_EXTERNAL_PARAMETER_ENTITY &&
       (entity->etype != XML_EXTERNAL_GENERAL_PARSED_ENTITY)))) ||
     (entity->content != (xmlChar *)0x0)) {
    xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,"xmlLoadEntityContent parameter error");
  }
  else {
    piVar4 = __xmlParserDebugEntities();
    if (*piVar4 != 0) {
      pp_Var5 = __xmlGenericError();
      p_Var1 = *pp_Var5;
      ppvVar6 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar6,"Reading %s entity content input\n",input->directory);
    }
    _c = xmlBufferCreate();
    if (_c == (xmlBufferPtr)0x0) {
      xmlFatalErr((xmlParserCtxtPtr)entity_local,XML_ERR_INTERNAL_ERROR,
                  "xmlLoadEntityContent parameter error");
    }
    else {
      buf = (xmlBufferPtr)
            xmlNewEntityInputStream((xmlParserCtxtPtr)entity_local,(xmlEntityPtr)input);
      if ((xmlParserInputPtr)buf == (xmlParserInputPtr)0x0) {
        xmlFatalErr((xmlParserCtxtPtr)entity_local,XML_ERR_INTERNAL_ERROR,
                    "xmlLoadEntityContent input error");
        xmlBufferFree(_c);
      }
      else {
        iVar3 = xmlPushInput((xmlParserCtxtPtr)entity_local,(xmlParserInputPtr)buf);
        if (iVar3 < 0) {
          xmlBufferFree(_c);
        }
        else {
          if ((*(int *)((long)&entity_local[3].parent + 4) == 0) &&
             ((long)entity_local->prev->parent - (long)entity_local->prev->last < 0xfa)) {
            xmlGROW((xmlParserCtxtPtr)entity_local);
          }
          local_38 = xmlCurrentChar((xmlParserCtxtPtr)entity_local,&count);
LAB_00176e7d:
          do {
            local_52 = false;
            if ((entity_local->prev == (_xmlNode *)buf) &&
               (local_52 = false, entity_local->prev->last < entity_local->prev->parent)) {
              if (local_38 < 0x100) {
                if (((local_38 < 9) || (local_52 = true, 10 < local_38)) &&
                   (local_52 = true, local_38 != 0xd)) {
                  local_52 = 0x1f < local_38;
                }
              }
              else if (((local_38 < 0x100) || (local_52 = true, 0xd7ff < local_38)) &&
                      ((local_38 < 0xe000 || (local_52 = true, 0xfffd < local_38)))) {
                local_52 = 0xffff < local_38 && local_38 < 0x110000;
              }
            }
            if (!local_52) {
              if ((entity_local->prev == (_xmlNode *)buf) &&
                 (entity_local->prev->parent <= entity_local->prev->last)) {
                xmlPopInput((xmlParserCtxtPtr)entity_local);
              }
              else if (local_38 < 0x100) {
                if (((local_38 < 9) || (10 < local_38)) && ((local_38 != 0xd && (local_38 < 0x20))))
                {
LAB_00177185:
                  xmlFatalErrMsgInt((xmlParserCtxtPtr)entity_local,XML_ERR_INVALID_CHAR,
                                    "xmlLoadEntityContent: invalid char value %d\n",local_38);
                  xmlBufferFree(_c);
                  return -1;
                }
              }
              else if ((((local_38 < 0x100) || (0xd7ff < local_38)) &&
                       ((local_38 < 0xe000 || (0xfffd < local_38)))) &&
                      ((local_38 < 0x10000 || (0x10ffff < local_38)))) goto LAB_00177185;
              input->encoding = _c->content;
              _c->content = (xmlChar *)0x0;
              xmlBufferFree(_c);
              return 0;
            }
            xmlBufferAdd(_c,(xmlChar *)entity_local->prev->last,count);
            bVar2 = 100 < local_3c;
            local_3c = local_3c + 1;
            if (bVar2) {
              local_3c = 0;
              if ((*(int *)((long)&entity_local[3].parent + 4) == 0) &&
                 ((long)entity_local->prev->parent - (long)entity_local->prev->last < 0xfa)) {
                xmlGROW((xmlParserCtxtPtr)entity_local);
              }
              if (*(int *)&entity_local[2]._private == -1) {
                xmlBufferFree(_c);
                return -1;
              }
            }
            if (*(char *)&entity_local->prev->last->_private == '\n') {
              *(int *)((long)&entity_local->prev->next + 4) =
                   *(int *)((long)&entity_local->prev->next + 4) + 1;
              *(undefined4 *)&entity_local->prev->prev = 1;
            }
            else {
              *(int *)&entity_local->prev->prev = *(int *)&entity_local->prev->prev + 1;
            }
            entity_local->prev->last =
                 (_xmlNode *)((long)&entity_local->prev->last->_private + (long)count);
            local_38 = xmlCurrentChar((xmlParserCtxtPtr)entity_local,&count);
          } while (local_38 != 0);
          local_3c = 0;
          if ((*(int *)((long)&entity_local[3].parent + 4) == 0) &&
             ((long)entity_local->prev->parent - (long)entity_local->prev->last < 0xfa)) {
            xmlGROW((xmlParserCtxtPtr)entity_local);
          }
          if (*(int *)&entity_local[2]._private != -1) {
            local_38 = xmlCurrentChar((xmlParserCtxtPtr)entity_local,&count);
            goto LAB_00176e7d;
          }
          xmlBufferFree(_c);
        }
      }
    }
  }
  return -1;
}

Assistant:

static int
xmlLoadEntityContent(xmlParserCtxtPtr ctxt, xmlEntityPtr entity) {
    xmlParserInputPtr input;
    xmlBufferPtr buf;
    int l, c;
    int count = 0;

    if ((ctxt == NULL) || (entity == NULL) ||
        ((entity->etype != XML_EXTERNAL_PARAMETER_ENTITY) &&
	 (entity->etype != XML_EXTERNAL_GENERAL_PARSED_ENTITY)) ||
	(entity->content != NULL)) {
	xmlFatalErr(ctxt, XML_ERR_INTERNAL_ERROR,
	            "xmlLoadEntityContent parameter error");
        return(-1);
    }

    if (xmlParserDebugEntities)
	xmlGenericError(xmlGenericErrorContext,
		"Reading %s entity content input\n", entity->name);

    buf = xmlBufferCreate();
    if (buf == NULL) {
	xmlFatalErr(ctxt, XML_ERR_INTERNAL_ERROR,
	            "xmlLoadEntityContent parameter error");
        return(-1);
    }

    input = xmlNewEntityInputStream(ctxt, entity);
    if (input == NULL) {
	xmlFatalErr(ctxt, XML_ERR_INTERNAL_ERROR,
	            "xmlLoadEntityContent input error");
	xmlBufferFree(buf);
        return(-1);
    }

    /*
     * Push the entity as the current input, read char by char
     * saving to the buffer until the end of the entity or an error
     */
    if (xmlPushInput(ctxt, input) < 0) {
        xmlBufferFree(buf);
	return(-1);
    }

    GROW;
    c = CUR_CHAR(l);
    while ((ctxt->input == input) && (ctxt->input->cur < ctxt->input->end) &&
           (IS_CHAR(c))) {
        xmlBufferAdd(buf, ctxt->input->cur, l);
	if (count++ > XML_PARSER_CHUNK_SIZE) {
	    count = 0;
	    GROW;
            if (ctxt->instate == XML_PARSER_EOF) {
                xmlBufferFree(buf);
                return(-1);
            }
	}
	NEXTL(l);
	c = CUR_CHAR(l);
	if (c == 0) {
	    count = 0;
	    GROW;
            if (ctxt->instate == XML_PARSER_EOF) {
                xmlBufferFree(buf);
                return(-1);
            }
	    c = CUR_CHAR(l);
	}
    }

    if ((ctxt->input == input) && (ctxt->input->cur >= ctxt->input->end)) {
        xmlPopInput(ctxt);
    } else if (!IS_CHAR(c)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlLoadEntityContent: invalid char value %d\n",
	                  c);
	xmlBufferFree(buf);
	return(-1);
    }
    entity->content = buf->content;
    buf->content = NULL;
    xmlBufferFree(buf);

    return(0);
}